

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O1

ref<immutable::rrb_details::leaf_node<int,_true>_> * __thiscall
immutable::ref<immutable::rrb_details::leaf_node<int,true>>::operator=
          (ref<immutable::rrb_details::leaf_node<int,true>> *this,
          ref<immutable::rrb_details::internal_node<int,_true>_> *r)

{
  int *piVar1;
  internal_node<int,_true> *piVar2;
  void *__ptr;
  
  piVar2 = r->ptr;
  if (piVar2 != (internal_node<int,_true> *)0x0) {
    LOCK();
    (piVar2->_ref_count).super___atomic_base<unsigned_int>._M_i =
         (piVar2->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
    UNLOCK();
  }
  __ptr = *(void **)this;
  *(internal_node<int,_true> **)this = piVar2;
  if (__ptr != (void *)0x0) {
    LOCK();
    piVar1 = (int *)((long)__ptr + 8);
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      free(__ptr);
    }
  }
  return (ref<immutable::rrb_details::leaf_node<int,_true>_> *)this;
}

Assistant:

ref<T>& ref<T>::operator = (const ref<U>& r)
      {
      ref<T> temp(r);
      swap(temp);
      return *this;
      }